

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O0

void __thiscall
acto::intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::queue
          (queue<acto::core::object_t,_acto::intrusive::spin_lock> *this)

{
  queue<acto::core::object_t,_acto::intrusive::spin_lock> *this_local;
  
  this->tail_ = (object_t *)0x0;
  spin_lock::spin_lock(&this->mutex_);
  return;
}

Assistant:

sequence<T> extract() {
    std::lock_guard g(mutex_);

    if (tail_) {
      T* head = tail_->next;

      tail_->next = nullptr;
      tail_ = nullptr;
      return sequence<T>(head);
    }
    return nullptr;
  }